

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestCompressionF<Counter<unsigned_int,32u>,Counter<unsigned_char,4u>>(int bias)

{
  uint uVar1;
  uint uVar2;
  uint absDiff;
  uint uVar3;
  uint uVar4;
  uint recent;
  uint uVar5;
  int delta;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  bVar8 = false;
  uVar3 = 0;
  do {
    uVar4 = uVar3 & 0xf;
    uVar5 = 0;
    do {
      uVar6 = uVar3 - uVar5;
      if (uVar3 < uVar5 || uVar6 == 0) {
        if ((int)(uVar5 - uVar3) <= (int)(bias + 8U)) goto LAB_0010254f;
      }
      else if ((int)uVar6 < (int)(8U - bias)) {
LAB_0010254f:
        uVar7 = uVar5 & 0x10 | uVar4;
        uVar1 = uVar5 & 0xf;
        if (uVar1 < uVar4) {
          uVar2 = uVar7 - 0x10;
          if (uVar4 - uVar1 < 8U - bias) {
            uVar2 = uVar7;
          }
        }
        else {
          uVar2 = uVar7 + 0x10;
          if (uVar1 - uVar4 <= bias + 8U) {
            uVar2 = uVar7;
          }
        }
        if (uVar2 != uVar3) {
          return bVar8;
        }
        if ((bias == 0) && (((uVar6 & 0xf) + uVar5) - (uVar6 * 2 & 0x10) != uVar3)) {
          return bVar8;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x20);
    bVar8 = 0x1e < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x20) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}